

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O2

CURLcode ssl_connect_init_proxy(connectdata *conn,int sockindex)

{
  long lVar1;
  undefined8 *puVar2;
  
  lVar1 = (long)sockindex;
  puVar2 = (undefined8 *)(lVar1 * 0x28);
  if ((conn->ssl[lVar1].state == ssl_connection_complete) && (conn->proxy_ssl[lVar1].use == false))
  {
    lVar1 = (long)puVar2 + (long)conn;
    puVar2 = (undefined8 *)(lVar1 + 0x290);
    *(undefined8 *)(lVar1 + 0x300) = *(undefined8 *)(lVar1 + 0x2b0);
    *(undefined8 *)(lVar1 + 0x2f0) = *(undefined8 *)(lVar1 + 0x2a0);
    *(undefined8 *)(lVar1 + 0x2f8) = *(undefined8 *)(lVar1 + 0x2a8);
    *(undefined8 *)(lVar1 + 0x2e0) = *puVar2;
    *(undefined8 *)(lVar1 + 0x2e8) = *(undefined8 *)(lVar1 + 0x298);
    *puVar2 = 0;
    *(undefined8 *)(lVar1 + 0x298) = 0;
    *(undefined8 *)(lVar1 + 0x2a0) = 0;
    *(undefined8 *)(lVar1 + 0x2a8) = 0;
    *(undefined8 *)(lVar1 + 0x2b0) = 0;
  }
  return (CURLcode)puVar2;
}

Assistant:

static CURLcode
ssl_connect_init_proxy(struct connectdata *conn, int sockindex)
{
  DEBUGASSERT(conn->bits.proxy_ssl_connected[sockindex]);
  if(ssl_connection_complete == conn->ssl[sockindex].state &&
     !conn->proxy_ssl[sockindex].use) {
#if defined(HTTPS_PROXY_SUPPORT)
    conn->proxy_ssl[sockindex] = conn->ssl[sockindex];
    memset(&conn->ssl[sockindex], 0, sizeof(conn->ssl[sockindex]));
#else
    return CURLE_NOT_BUILT_IN;
#endif
  }
  return CURLE_OK;
}